

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

stbi_uc * stbi_load_from_callbacks
                    (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc *psVar1;
  int iVar2;
  uchar *puVar3;
  stbi__context s;
  stbi__context local_100;
  
  local_100.io.eof = clbk->eof;
  psVar1 = local_100.buffer_start;
  local_100.io.read._0_4_ = *(undefined4 *)&clbk->read;
  local_100.io.read._4_4_ = *(undefined4 *)((long)&clbk->read + 4);
  local_100.io.skip._0_4_ = *(undefined4 *)&clbk->skip;
  local_100.io.skip._4_4_ = *(undefined4 *)((long)&clbk->skip + 4);
  local_100.read_from_callbacks = 1;
  local_100.buflen = 0x80;
  local_100.io_user_data = user;
  local_100.img_buffer_original = psVar1;
  iVar2 = (*clbk->read)(user,(char *)psVar1,0x80);
  if (iVar2 == 0) {
    local_100.img_buffer_end = local_100.buffer_start + 1;
    local_100._48_8_ = local_100._48_8_ & 0xffffffff00000000;
    local_100.buffer_start[0] = '\0';
  }
  else {
    local_100.img_buffer_end = psVar1 + iVar2;
  }
  local_100.img_buffer = psVar1;
  local_100.img_buffer_original_end = local_100.img_buffer_end;
  puVar3 = stbi__load_and_postprocess_8bit(&local_100,x,y,comp,req_comp);
  return puVar3;
}

Assistant:

STBIDEF stbi_uc *stbi_load_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__load_and_postprocess_8bit(&s,x,y,comp,req_comp);
}